

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O3

void __thiscall gulcalc::outputmode1data(gulcalc *this,int event_id)

{
  pointer *ppgVar1;
  float tiv;
  double dVar2;
  int iVar3;
  rd_option rVar4;
  iterator iVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  pointer ppVar10;
  ulong uVar11;
  undefined8 extraout_RAX;
  long lVar12;
  long lVar13;
  pointer pvVar14;
  long lVar15;
  int iVar16;
  getRands *pgVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  undefined4 uVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  OASIS_FLOAT OVar25;
  OASIS_FLOAT rval;
  float fVar26;
  gulItemIDLoss gi;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv;
  gulItemIDLoss local_118;
  undefined1 local_108 [8];
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong local_f0;
  int *local_e8;
  ulong local_e0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  local_d8;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  local_b8;
  long local_a0;
  undefined1 local_94 [12];
  pointer local_88;
  pointer local_80;
  long local_78;
  long local_70;
  double local_68;
  ulong local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_e8 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_e8 !=
      (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70 = (long)(int)this->rnd_->buffersize_;
    local_78 = (long)event_id;
    local_a0 = (local_78 * 0x73d3fc6f) % 0x80000000;
    do {
      local_b8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::resize(&local_b8,(long)(this->samplesize_ + 1 + this->num_idx_));
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        std::
        vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
        ::resize(&local_d8,(long)(this->num_idx_ + this->samplesize_ + 1));
      }
      iVar3 = *local_e8;
      pvVar14 = (this->mode1_stats_).
                super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar10 = pvVar14[iVar3].super__Vector_base<processrecData,_std::allocator<processrecData>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_80 = *(pointer *)
                  ((long)&pvVar14[iVar3].
                          super__Vector_base<processrecData,_std::allocator<processrecData>_>.
                          _M_impl.super__Vector_impl_data + 8);
      if ((long)local_80 - (long)ppVar10 != 0) {
        tiv = (this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
        local_68 = (double)(tiv / (float)(ulong)(((long)local_80 - (long)ppVar10 >> 4) *
                                                -0x5555555555555555));
        uVar20 = 0;
        local_88 = ppVar10;
        do {
          lVar13 = uVar20 * 0x30;
          local_118.item_id = ppVar10[uVar20].item_id;
          local_118.loss = (double)ppVar10[uVar20].max_loss;
          iVar16 = this->num_idx_;
          iVar5._M_current =
               local_b8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -5].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              local_b8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -5].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_b8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -5),iVar5,
                       &local_118);
          }
          else {
            *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
            (iVar5._M_current)->loss = local_118.loss;
            ppgVar1 = &local_b8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -5].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar16 = this->num_idx_;
            iVar5._M_current =
                 local_d8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -5].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                local_d8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -5].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_d8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -5),iVar5,
                         &local_118);
            }
            else {
              *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
              (iVar5._M_current)->loss = local_118.loss;
              ppgVar1 = &local_d8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -5].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          local_118.loss = local_68;
          iVar16 = this->num_idx_;
          iVar5._M_current =
               local_b8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -3].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              local_b8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -3].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_b8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -3),iVar5,
                       &local_118);
          }
          else {
            *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
            (iVar5._M_current)->loss = local_68;
            ppgVar1 = &local_b8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -3].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar16 = this->num_idx_;
            iVar5._M_current =
                 local_d8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -3].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                local_d8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -3].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_d8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -3),iVar5,
                         &local_118);
            }
            else {
              *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
              (iVar5._M_current)->loss = local_118.loss;
              ppgVar1 = &local_d8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -3].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          local_118.loss =
               (double)*(float *)(*(long *)&(this->mode1_stats_).
                                            super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                            super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                            ._M_impl.super__Vector_impl_data + 4 + lVar13);
          iVar16 = this->num_idx_;
          iVar5._M_current =
               local_b8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -2].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              local_b8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -2].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_b8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -2),iVar5,
                       &local_118);
          }
          else {
            *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
            (iVar5._M_current)->loss = local_118.loss;
            ppgVar1 = &local_b8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -2].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar16 = this->num_idx_;
            iVar5._M_current =
                 local_d8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -2].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                local_d8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -2].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_d8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -2),iVar5,
                         &local_118);
            }
            else {
              *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
              (iVar5._M_current)->loss = local_118.loss;
              ppgVar1 = &local_d8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -2].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          local_118.loss =
               (double)*(float *)(*(long *)&(this->mode1_stats_).
                                            super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                            super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                            ._M_impl.super__Vector_impl_data + lVar13);
          iVar16 = this->num_idx_;
          iVar5._M_current =
               local_b8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              local_b8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_b8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -1),iVar5,
                       &local_118);
          }
          else {
            *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
            (iVar5._M_current)->loss = local_118.loss;
            ppgVar1 = &local_b8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar16 = this->num_idx_;
            iVar5._M_current =
                 local_d8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                local_d8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_d8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + -1),iVar5,
                         &local_118);
            }
            else {
              *(ulong *)iVar5._M_current = CONCAT44(local_118._4_4_,local_118.item_id);
              (iVar5._M_current)->loss = local_118.loss;
              ppgVar1 = &local_d8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          rVar4 = this->rndopt_;
          if (rVar4 == usecachedvector) {
            pvVar14 = (this->mode1_stats_).
                      super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar19 = this->samplesize_;
            local_e0 = (ulong)(*(int *)(*(long *)&pvVar14[iVar3].
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  ._M_impl.super__Vector_impl_data + 0x10 + lVar13)
                              * uVar19);
            local_f0 = (ulong)uVar19;
          }
          else {
            if (rVar4 == usehashedseed) {
              pvVar14 = (this->mode1_stats_).
                        super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar16 = this->rand_seed_;
              pgVar17 = this->rnd_;
              uVar11 = (ulong)(*(int *)(*(long *)&pvVar14[iVar3].
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  ._M_impl.super__Vector_impl_data + 0x10 + lVar13)
                               * 0x5bfc6fdb + (int)local_a0 + iVar16 & 0x7fffffff);
              (pgVar17->gen_)._M_x[0] = uVar11;
              lVar12 = 4;
              do {
                uVar11 = (ulong)((((uint)(uVar11 >> 0x1e) ^ (uint)uVar11) * 0x6c078965 + (int)lVar12
                                 ) - 3);
                (pgVar17->gen_)._M_x[lVar12 + -3] = uVar11;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0x273);
              (pgVar17->gen_)._M_p = 0x270;
              local_e0 = 0;
              if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
                pgVar17 = this->rnd0_;
                uVar11 = (ulong)(iVar16 + (int)local_a0 & 0x7fffffff);
                (pgVar17->gen_)._M_x[0] = uVar11;
                lVar12 = 4;
                do {
                  uVar11 = (ulong)((((uint)(uVar11 >> 0x1e) ^ (uint)uVar11) * 0x6c078965 +
                                   (int)lVar12) - 3);
                  (pgVar17->gen_)._M_x[lVar12 + -3] = uVar11;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 0x273);
                (pgVar17->gen_)._M_p = 0x270;
              }
              local_f0 = 0;
            }
            else {
              if (rVar4 != userandomnumberfile) {
                outputmode1data();
                std::
                vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ::~vector(&local_d8);
                std::
                vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ::~vector(&local_b8);
                _Unwind_Resume(extraout_RAX);
              }
              pvVar14 = (this->mode1_stats_).
                        super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar15 = this->p3_ * this->p1_;
              lVar12 = this->p2_ * local_78;
              local_e0 = (*(int *)(*(long *)&pvVar14[iVar3].
                                             super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                             ._M_impl.super__Vector_impl_data + 0x10 + lVar13) *
                          lVar15 + lVar12) % local_70;
              local_f0 = (lVar12 + lVar15) % local_70;
            }
            uVar19 = this->samplesize_;
          }
          if (0 < (int)uVar19) {
            iVar16 = 0;
            local_60 = uVar20;
            do {
              pgVar17 = this->rnd_;
              if (this->rndopt_ == usehashedseed) {
                dVar6 = std::
                        generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                  (&pgVar17->gen_);
                dVar2 = (pgVar17->dis_)._M_param._M_a;
                fVar26 = (float)(dVar6 * ((pgVar17->dis_)._M_param._M_b - dVar2) + dVar2);
                if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) {
LAB_00103ed2:
                  rval = 0.0;
                }
                else {
                  _local_108 = ZEXT416((uint)fVar26);
                  pgVar17 = this->rnd0_;
                  dVar2 = std::
                          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                    (&pgVar17->gen_);
                  uVar21 = SUB84(dVar2,0);
                  uVar24 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_00103e64:
                  dVar2 = (pgVar17->dis_)._M_param._M_a;
                  rval = (OASIS_FLOAT)
                         ((double)CONCAT44(uVar24,uVar21) * ((pgVar17->dis_)._M_param._M_b - dVar2)
                         + dVar2);
LAB_00103e89:
                  fVar26 = (float)local_108._0_4_;
                }
              }
              else {
                uVar19 = iVar16 + (int)local_e0;
                rVar4 = pgVar17->rndopt_;
                if (rVar4 == usecachedvector) {
                  fVar26 = (pgVar17->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(ulong)uVar19 % (ulong)(uint)pgVar17->rand_vec_size_];
                  if (fVar26 < 0.0) {
                    dVar6 = std::
                            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                      (&pgVar17->gen_);
                    dVar2 = (pgVar17->dis_)._M_param._M_a;
                    fVar26 = (float)(dVar6 * ((pgVar17->dis_)._M_param._M_b - dVar2) + dVar2);
                    (pgVar17->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(ulong)uVar19 % (ulong)(uint)pgVar17->rand_vec_size_] = fVar26;
                  }
                }
                else if (rVar4 == usehashedseed) {
                  dVar6 = std::
                          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                    (&pgVar17->gen_);
                  dVar2 = (pgVar17->dis_)._M_param._M_a;
                  fVar26 = (float)(dVar6 * ((pgVar17->dis_)._M_param._M_b - dVar2) + dVar2);
                }
                else if (rVar4 == userandomnumberfile) {
                  uVar9 = pgVar17->buffersize_;
                  if (uVar19 < uVar9) {
                    uVar9 = 0;
                  }
                  fVar26 = pgVar17->buf_[uVar19 - uVar9];
                }
                else {
                  fprintf(_stderr,"Invalid rndopt_: %d");
                  fVar26 = 0.0;
                }
                rval = 0.0;
                if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
                  pgVar17 = this->rnd0_;
                  uVar19 = iVar16 + (int)local_f0;
                  rVar4 = pgVar17->rndopt_;
                  if (rVar4 == usecachedvector) {
                    rval = (pgVar17->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(ulong)uVar19 % (ulong)(uint)pgVar17->rand_vec_size_];
                    if (rval < 0.0) {
                      _local_108 = ZEXT416((uint)fVar26);
                      dVar6 = std::
                              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                        (&pgVar17->gen_);
                      dVar2 = (pgVar17->dis_)._M_param._M_a;
                      rval = (OASIS_FLOAT)(dVar6 * ((pgVar17->dis_)._M_param._M_b - dVar2) + dVar2);
                      (pgVar17->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(ulong)uVar19 % (ulong)(uint)pgVar17->rand_vec_size_] = rval;
                      goto LAB_00103e89;
                    }
                  }
                  else {
                    if (rVar4 == usehashedseed) {
                      _local_108 = ZEXT416((uint)fVar26);
                      dVar2 = std::
                              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                        (&pgVar17->gen_);
                      uVar21 = SUB84(dVar2,0);
                      uVar24 = (undefined4)((ulong)dVar2 >> 0x20);
                      goto LAB_00103e64;
                    }
                    if (rVar4 != userandomnumberfile) {
                      _local_108 = ZEXT416((uint)fVar26);
                      fprintf(_stderr,"Invalid rndopt_: %d");
                      fVar26 = (float)local_108._0_4_;
                      goto LAB_00103ed2;
                    }
                    uVar9 = pgVar17->buffersize_;
                    if (uVar19 < uVar9) {
                      uVar9 = 0;
                    }
                    rval = pgVar17->buf_[uVar19 - uVar9];
                  }
                }
              }
              lVar12 = *(long *)&(this->mode1_stats_).
                                 super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                 super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar15 = *(long *)(lVar12 + 0x20 + lVar13);
              fVar23 = (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>
                       ._M_impl.super__Vector_impl_data._M_start[*(int *)(lVar15 + -4)].prob_to;
              uVar24 = (undefined4)((ulong)((double)fVar23 + -3e-08) >> 0x20);
              fVar22 = (float)((double)fVar23 + -3e-08);
              uVar21 = 0;
              if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
                rval = (OASIS_FLOAT)
                       (-(uint)(rval < fVar23) & (uint)rval | ~-(uint)(rval < fVar23) & (uint)fVar22
                       );
                uVar21 = uVar24;
              }
              iVar16 = iVar16 + 1;
              uVar19 = (uint)((ulong)(lVar15 - *(long *)(lVar12 + 0x18 + lVar13)) >> 2);
              if (0 < (int)uVar19) {
                fVar26 = (float)(-(uint)(fVar26 < fVar23) & (uint)fVar26 |
                                ~-(uint)(fVar26 < fVar23) & (uint)fVar22);
                fVar23 = 0.0;
                uVar20 = 0;
                bVar8 = false;
                bVar7 = false;
                local_48 = CONCAT44(uVar21,rval);
                uStack_40 = 0;
                uStack_50 = 0;
                uStack_4c = 0;
                local_58 = fVar26;
                uStack_54 = uVar24;
                do {
                  local_94._4_8_ =
                       (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)(*(long *)(*(long *)&(this->mode1_stats_).
                                                                                                          
                                                  super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18 + lVar13)
                                + uVar20 * 4)];
                  fVar22 = (float)local_94._4_8_;
                  OVar25 = SUB84(local_94._4_8_,4);
                  uVar21 = 0;
                  uVar24 = 0;
                  local_94._0_4_ = fVar23;
                  if ((fVar26 < fVar22) && (!bVar7)) {
                    _uStack_100 = 0;
                    local_108._0_4_ = (OASIS_FLOAT)local_94._4_8_;
                    local_108._4_4_ = SUB84(local_94._4_8_,4);
                    fillgulitemloss(this,local_118.item_id,tiv,event_id,(int)uVar20,fVar26,
                                    (probrec *)local_94,iVar16,&local_b8);
                    bVar7 = true;
                    fVar22 = (float)local_108._0_4_;
                    OVar25 = (OASIS_FLOAT)local_108._4_4_;
                    uVar21 = uStack_100;
                    uVar24 = uStack_fc;
                    rval = (OASIS_FLOAT)local_48;
                    fVar26 = local_58;
                    if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) break;
                  }
                  fVar23 = fVar22;
                  if (((this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) &&
                      (rval < fVar22)) && (!bVar8)) {
                    bVar8 = true;
                    local_108._4_4_ = OVar25;
                    local_108._0_4_ = fVar22;
                    uStack_100 = uVar21;
                    uStack_fc = uVar24;
                    fillgulitemloss(this,local_118.item_id,tiv,event_id,(int)uVar20,rval,
                                    (probrec *)local_94,iVar16,&local_d8);
                    fVar23 = (float)local_108._0_4_;
                    rval = (OASIS_FLOAT)local_48;
                    fVar26 = local_58;
                  }
                  if (((bVar7) && (bVar8)) || (uVar20 = uVar20 + 1, (uVar19 & 0x7fffffff) == uVar20)
                     ) break;
                } while( true );
              }
            } while (iVar16 < this->samplesize_);
            pvVar14 = (this->mode1_stats_).
                      super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar20 = local_60;
          }
          uVar20 = uVar20 + 1;
          ppVar10 = pvVar14[iVar3].
                    super__Vector_base<processrecData,_std::allocator<processrecData>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar20 < (ulong)(((long)*(pointer *)
                                          ((long)&pvVar14[iVar3].
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)ppVar10 >> 4) * -0x5555555555555555));
        if ((local_80 != local_88) &&
           (writemode1output(this,event_id,tiv,&local_b8,false),
           this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0)) {
          writemode1output(this,event_id,tiv,&local_d8,true);
        }
      }
      piVar18 = local_e8 + 1;
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::~vector(&local_d8);
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::~vector(&local_b8);
      local_e8 = piVar18;
    } while (piVar18 !=
             (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  clearmode1_data(this);
  return;
}

Assistant:

void gulcalc::outputmode1data(int event_id) {

	int rnd_count = rnd_->rdxmax();

	auto cov_iter = mode1UsedCoverageIDs_.begin();
	while (cov_iter != mode1UsedCoverageIDs_.end()) {

		std::vector<std::vector<gulItemIDLoss>> gilv;
		std::vector<std::vector<gulItemIDLoss>> gilv0;
		gilv.resize(samplesize_ + num_idx_ + 1);
		if (correlatedWriter_) gilv0.resize(samplesize_ + num_idx_ + 1);
		int j = *cov_iter;
		OASIS_FLOAT tiv = 0.0;
		OASIS_FLOAT exposureValue = 0.0;
		bool hasData = false;
		if (mode1_stats_[j].size() > 0) {
			tiv = (*coverages_)[j];
			exposureValue = tiv / mode1_stats_[j].size();
			hasData = true;
		}

		for (size_t i = 0; i < mode1_stats_[j].size(); i++) {

			gulItemIDLoss gi;
			gi.item_id = mode1_stats_[j][i].item_id;

			// maximum loss
			gi.loss = mode1_stats_[j][i].max_loss;
			gilv[max_loss_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[max_loss_idx + num_idx_].push_back(gi);

			// exposure value record
			// tiv / count(tuple(event_id-coverage_id))
			gi.loss = exposureValue;
			gilv[tiv_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[tiv_idx + num_idx_].push_back(gi);

			// standard deviation
			gi.loss = mode1_stats_[j][i].std_dev;
			gilv[std_dev_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[std_dev_idx + num_idx_].push_back(gi);

			// mean
			gi.loss = mode1_stats_[j][i].gul_mean;
			gilv[mean_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[mean_idx + num_idx_].push_back(gi);

			int ridx = 0;
			int ridx0 = 0;
			switch (rndopt_) {
				case rd_option::userandomnumberfile:
					ridx = ((mode1_stats_[j][i].group_id * p1_ * p3_) + (event_id * p2_)) % rnd_count;
					ridx0 = ((p1_ * p3_) + (event_id * p2_)) % rnd_count;
					break;
				case rd_option::usecachedvector:
					ridx = mode1_stats_[j][i].group_id * samplesize_;
					ridx0 = samplesize_;
					break;
				case rd_option::usehashedseed:
				{
					unsigned long long s1 = (mode1_stats_[j][i].group_id * 1543270363L) % 2147483648L;   // hash group_id and event_id to seed random number
					unsigned long long s2 = (event_id * 1943272559L) % 2147483648L;
					s1 = (s1 + s2 + rand_seed_) % 2147483648L;
					rnd_->seedRands(s1);
					if (correlatedWriter_) {
						s2 = (s2 + rand_seed_) % 2147483648L;
						rnd0_->seedRands(s2);
					}
				}
				break;
				default:
					fprintf(stderr, "FATAL: %s: Unknown random number option\n", __func__);
					exit(-1);
			}

			// Generate losses for each sample
			for (int k = 0; k < samplesize_; k++) {

				OASIS_FLOAT rval;
				OASIS_FLOAT rval0 = 0;

				if (rndopt_ == rd_option::usehashedseed) {
					rval = rnd_->nextrnd();
					if (correlatedWriter_) rval0 = rnd0_->nextrnd();
				} else {
					rval = rnd_->rnd(ridx + k);
					if (correlatedWriter_) rval0 = rnd0_->rnd(ridx0 + k);
				}

				// If required set random number to just under
				// maximum prob_to (which should be 1)
				OASIS_FLOAT prob_to_max = bin_lookup_[mode1_stats_[j][i].bin_map_ids.back()].prob_to;
				if (rval >= prob_to_max) {
					rval = prob_to_max - 0.00000003;
				}
				if (correlatedWriter_ && rval0 >= prob_to_max) {
					rval0 = prob_to_max - 0.00000003;
				}

				OASIS_FLOAT last_prob_to = 0;
				bool hit_rval = false;
				bool hit_rval0 = false;
				int max_bin_end = (int)mode1_stats_[j][i].bin_map_ids.size();
				for (int bin_index = 0; bin_index < max_bin_end; bin_index++) {

					prob_mean pp = bin_lookup_[mode1_stats_[j][i].bin_map_ids[bin_index]];
					probrec p;
					p.prob_from = last_prob_to;
					p.prob_to = pp.prob_to;
					p.bin_mean = pp.bin_mean;
					last_prob_to = pp.prob_to;

					if (rval < p.prob_to && !hit_rval) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval, p, k+1, gilv);
						if (!correlatedWriter_) break;
						else hit_rval = true;
					}
					if (correlatedWriter_ && rval0 < p.prob_to && !hit_rval0) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval0, p, k+1, gilv0);
						hit_rval0 = true;
					}
					if (hit_rval && hit_rval0) break;

				}

			}

		}

		if (hasData) {

			writemode1output(event_id, tiv, gilv);
			if (correlatedWriter_) {
				writemode1output(event_id, tiv, gilv0, true);
			}

		}

		cov_iter++;

	}

	clearmode1_data();

}